

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_str_hash.c
# Opt level: O0

uint32_t hash_16_128(uint64_t seed,char *str,uint32_t len)

{
  uint uVar1;
  uint32_t uVar2;
  uint64_t *puVar3;
  long lVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  uint local_84;
  long lStack_80;
  uint32_t i;
  uint64_t h2;
  uint64_t h1;
  uint32_t len_local;
  char *str_local;
  uint64_t seed_local;
  
  uVar1 = crc32(0,len ^ (uint)seed);
  h2 = (uint64_t)uVar1;
  lStack_80 = 0;
  for (local_84 = 0; local_84 < len - 0x10; local_84 = local_84 + 0x10) {
    puVar3 = cast_uint64p(str + local_84);
    lVar4 = crc32(h2,*puVar3);
    h2 = lVar4 + h2;
    puVar3 = cast_uint64p(str + (ulong)local_84 + 8);
    lVar4 = crc32(lStack_80,*puVar3);
    lStack_80 = lVar4 + lStack_80;
  }
  puVar3 = cast_uint64p(str + ((ulong)len - 0x10));
  uVar5 = crc32(h2,*puVar3);
  puVar3 = cast_uint64p(str + ((ulong)len - 8));
  uVar6 = crc32(lStack_80,*puVar3);
  uVar2 = crc32((int)uVar5,(int)uVar6);
  return uVar2;
}

Assistant:

static uint32_t hash_16_128(uint64_t seed, const char* str,
				   uint32_t len)
{
  uint64_t h1, h2;
  uint32_t i;

  h1 = lj_crc32_u32(0, len ^ seed);
  h2 = 0;

  for (i = 0; i < len - 16; i += 16) {
    h1 += lj_crc32_u64(h1, *cast_uint64p(str + i));
    h2 += lj_crc32_u64(h2, *cast_uint64p(str + i + 8));
  };

  h1 = lj_crc32_u64(h1, *cast_uint64p(str + len - 16));
  h2 = lj_crc32_u64(h2, *cast_uint64p(str + len - 8));

  return lj_crc32_u32(h1, h2);
}